

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer
          (QSharedDataPointer<QStyleSheetOutlineData> *this)

{
  QStyleSheetOutlineData *pQVar1;
  long lVar2;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QStyleSheetOutlineData *)0x0) {
    LOCK();
    (pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QStyleSheetOutlineData *)0x0) {
        QSharedDataPointer<QStyleSheetBorderImageData>::~QSharedDataPointer
                  (&(pQVar1->super_QStyleSheetBorderData).bi);
        lVar2 = 0x30;
        do {
          QBrush::~QBrush((QBrush *)
                          ((long)(pQVar1->super_QStyleSheetBorderData).borders + lVar2 + -4));
          lVar2 = lVar2 + -8;
        } while (lVar2 != 0x10);
      }
      operator_delete(pQVar1,0x80);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }